

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O1

CommandSignature __thiscall llbuild::buildsystem::Command::getSignature(Command *this)

{
  hash_code hVar1;
  hash_combine_recursive_helper local_90;
  
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_90);
  local_90.buffer[0] = '\0';
  local_90.buffer[1] = '\0';
  local_90.buffer[2] = '\0';
  local_90.buffer[3] = '\0';
  local_90.buffer[4] = '\0';
  local_90.buffer[5] = '\0';
  local_90.buffer[6] = '\0';
  local_90.buffer[7] = '\0';
  hVar1 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_90,0,local_90.buffer + 8,(char *)&local_90.state,&this->name);
  return (CommandSignature)hVar1.value;
}

Assistant:

basic::CommandSignature Command::getSignature() const {
  return basic::CommandSignature().combine(name);
}